

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O3

uint32_t *
createDFDPackedShifted
          (int bigEndian,int numChannels,int *bits,int *shiftBits,int *channels,VkSuffix suffix)

{
  int sampleNo;
  size_t sVar1;
  uint uVar2;
  uint32_t *DFD;
  int bits_00;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int bits_01;
  uint32_t uVar10;
  long lVar11;
  int beChannelStart [4];
  int bitChannel [32];
  
  if (numChannels == 6) {
    DFD = (uint32_t *)malloc(0x7c);
    DFD[0] = 0x7c;
    DFD[1] = 0;
    DFD[2] = 0x780002;
    DFD[3] = 0x10101;
    DFD[4] = 0;
    DFD[5] = 4;
    DFD[6] = 0;
    DFD[7] = 0x80000;
    DFD[8] = 0;
    DFD[9] = 0;
    DFD[10] = 0x2100;
    DFD[0xb] = 0x2004001b;
    DFD[0xc] = 0;
    DFD[0xd] = 0xf;
    DFD[0xe] = 0x1f;
    DFD[0xf] = 0x1080009;
    DFD[0x10] = 0;
    DFD[0x11] = 0;
    DFD[0x12] = 0x2100;
    DFD[0x13] = 0x2104001b;
    DFD[0x14] = 0;
    DFD[0x15] = 0xf;
    DFD[0x16] = 0x1f;
    DFD[0x17] = 0x2080012;
    DFD[0x18] = 0;
    DFD[0x19] = 0;
    DFD[0x1a] = 0x2100;
    DFD[0x1b] = 0x2204001b;
    DFD[0x1c] = 0;
    DFD[0x1d] = 0xf;
    DFD[0x1e] = 0x1f;
  }
  else if (bigEndian == 0) {
    uVar10 = 0;
    if (0 < numChannels) {
      uVar4 = 0;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + shiftBits[uVar4] + bits[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)numChannels != uVar4);
      uVar10 = iVar9 >> 3;
    }
    sVar1 = (long)(numChannels * 4) * 4 + 0x1c;
    DFD = (uint32_t *)malloc(sVar1);
    *DFD = (uint32_t)sVar1;
    DFD[1] = 0;
    DFD[2] = numChannels * 0x100000 + 0x180002;
    DFD[3] = (uint)(suffix == s_SRGB) * 0x10000 + 0x10101;
    DFD[4] = 0;
    DFD[5] = uVar10;
    DFD[6] = 0;
    if (0 < numChannels) {
      uVar4 = 0;
      iVar9 = 0;
      do {
        iVar5 = shiftBits[uVar4];
        writeSample(DFD,(int)uVar4,channels[uVar4],bits[uVar4],iVar9 + iVar5,1,1,suffix);
        iVar9 = iVar9 + iVar5 + bits[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)numChannels != uVar4);
    }
  }
  else {
    if (numChannels < 1) {
      uVar2 = 0x18;
      iVar9 = 0;
    }
    else {
      uVar4 = (ulong)(uint)numChannels;
      uVar3 = 0;
      iVar9 = 0;
      do {
        beChannelStart[uVar3] = iVar9;
        iVar9 = iVar9 + shiftBits[uVar3] + bits[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      uVar8 = iVar9 - 1U & 0x18;
      uVar2 = iVar9 - 1U & 0x18;
      if (0 < numChannels) {
        uVar3 = 0;
        iVar5 = 0;
        do {
          uVar7 = iVar5 + shiftBits[uVar3];
          bitChannel[(int)(uVar7 ^ uVar8)] = (int)uVar3;
          iVar5 = bits[uVar3];
          uVar6 = (iVar5 + uVar7) - 1 & 0xfffffff8;
          if (uVar6 != (uVar7 & 0xfffffff8)) {
            bitChannel[(int)(uVar6 ^ uVar8)] = (int)uVar3;
            numChannels = numChannels + 1;
          }
          iVar5 = iVar5 + uVar7;
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
    }
    sVar1 = (long)(numChannels * 4) * 4 + 0x1c;
    DFD = (uint32_t *)malloc(sVar1);
    *DFD = (uint32_t)sVar1;
    DFD[1] = 0;
    DFD[2] = numChannels * 0x100000 + 0x180002;
    DFD[3] = (uint)(suffix == s_SRGB) * 0x10000 + 0x10101;
    DFD[4] = 0;
    DFD[5] = iVar9 >> 3;
    DFD[6] = 0;
    if (0 < iVar9) {
      iVar5 = 0;
      uVar8 = 0;
      do {
        lVar11 = (long)bitChannel[(int)uVar8];
        if (lVar11 == -1) {
          uVar8 = (uVar8 & 0xfffffff8) + 8;
        }
        else {
          uVar6 = beChannelStart[lVar11] ^ uVar2;
          if (uVar6 == uVar8) {
            writeSample(DFD,iVar5,channels[lVar11],bits[lVar11],uVar8,1,1,suffix);
            bits_01 = bits[lVar11];
            iVar5 = iVar5 + 1;
          }
          else {
            bits_00 = 8 - (beChannelStart[lVar11] & 7U);
            bits_01 = bits[lVar11] - bits_00;
            sampleNo = iVar5 + 1;
            writeSample(DFD,iVar5,channels[lVar11],bits_00,uVar6,0,1,suffix);
            bitChannel[(int)uVar6] = -1;
            iVar5 = iVar5 + 2;
            writeSample(DFD,sampleNo,channels[lVar11],bits_01,uVar8,1,0,suffix);
          }
          uVar8 = uVar8 + bits_01;
        }
      } while ((int)uVar8 < iVar9);
    }
  }
  return DFD;
}

Assistant:

uint32_t *createDFDPackedShifted(int bigEndian, int numChannels,
                                 int bits[], int shiftBits[], int channels[],
                                 enum VkSuffix suffix)
{
    uint32_t *DFD = 0;
    if (numChannels == 6) {
        /* Special case E5B9G9R9 */
        DFD = writeHeader(numChannels, 4, s_UFLOAT, i_COLOR);
        writeSample(DFD, 0, 0,
                    9, 0,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 0, SAMPLEUPPER, 8448);
        writeSample(DFD, 1, 0 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 1, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 1, SAMPLEUPPER, 31);
        writeSample(DFD, 2, 1,
                    9, 9,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 2, SAMPLEUPPER, 8448);
        writeSample(DFD, 3, 1 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 3, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 3, SAMPLEUPPER, 31);
        writeSample(DFD, 4, 2,
                    9, 18,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 4, SAMPLEUPPER, 8448);
        writeSample(DFD, 5, 2 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 5, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 5, SAMPLEUPPER, 31);
    } else if (bigEndian) {
        /* No packed format is larger than 32 bits. */
        /* No packed channel crosses more than two bytes. */
        int totalBits = 0;
        int bitChannel[32];
        int beChannelStart[4];
        int channelCounter;
        int bitOffset = 0;
        int BEMask;
        int numSamples = numChannels;
        int sampleCounter;
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            beChannelStart[channelCounter] = totalBits;
            totalBits += shiftBits[channelCounter] + bits[channelCounter];
        }
        BEMask = (totalBits - 1) & 0x18;
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            bitOffset += shiftBits[channelCounter];
            bitChannel[bitOffset ^ BEMask] = channelCounter;
            if (((bitOffset + bits[channelCounter] - 1) & ~7) != (bitOffset & ~7)) {
                /* Continuation sample */
                bitChannel[((bitOffset + bits[channelCounter] - 1) & ~7) ^ BEMask] = channelCounter;
                numSamples++;
            }
            bitOffset += bits[channelCounter];
        }
        DFD = writeHeader(numSamples, totalBits >> 3, suffix, i_COLOR);

        sampleCounter = 0;
        for (bitOffset = 0; bitOffset < totalBits;) {
            if (bitChannel[bitOffset] == -1) {
                /* Done this bit, so this is the lower half of something. */
                /* We must therefore jump to the end of the byte and continue. */
                bitOffset = (bitOffset + 8) & ~7;
            } else {
                /* Start of a channel? */
                int thisChannel = bitChannel[bitOffset];
                if ((beChannelStart[thisChannel] ^ BEMask) == bitOffset) {
                    /* Must be just one sample if we hit it first. */
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                    bits[thisChannel], bitOffset,
                                    1, 1, suffix);
                    bitOffset += bits[thisChannel];
                } else {
                    /* Two samples. Move to the end of the first one we hit when we're done. */
                    int firstSampleBits = 8 - (beChannelStart[thisChannel] & 0x7); /* Rest of the byte */
                    int secondSampleBits = bits[thisChannel] - firstSampleBits; /* Rest of the bits */
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                firstSampleBits, beChannelStart[thisChannel] ^ BEMask,
                                0, 1, suffix);
                    /* Mark that we've already handled this sample */
                    bitChannel[beChannelStart[thisChannel] ^ BEMask] = -1;
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                secondSampleBits, bitOffset,
                                1, 0, suffix);
                    bitOffset += secondSampleBits;
                }
            }
        }

    } else { /* Little-endian */

        int sampleCounter;
        int totalBits = 0;
        int bitOffset = 0;
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            totalBits += shiftBits[sampleCounter] + bits[sampleCounter];
        }

        /* One sample per channel */
        DFD = writeHeader(numChannels, totalBits >> 3, suffix, i_COLOR);
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            bitOffset += shiftBits[sampleCounter];
            writeSample(DFD, sampleCounter, channels[sampleCounter],
                        bits[sampleCounter], bitOffset,
                        1, 1, suffix);
            bitOffset += bits[sampleCounter];
        }
    }
    return DFD;
}